

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  stbi_uc sVar2;
  byte bVar3;
  stbi_uc sVar4;
  byte bVar5;
  int iVar6;
  stbi__uint32 sVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  char *__nptr;
  char *local_4890;
  stbi__jpeg j;
  
  j.s = s;
  iVar6 = stbi__decode_jpeg_header(&j,2);
  if (iVar6 != 0) {
LAB_001058d9:
    if (x != (int *)0x0) {
      *x = (j.s)->img_x;
    }
    if (y != (int *)0x0) {
      *y = (j.s)->img_y;
    }
    if (comp != (int *)0x0) {
      *comp = (j.s)->img_n;
    }
    return 1;
  }
  (j.s)->img_buffer = (j.s)->img_buffer_original;
  j.s = s;
  iVar6 = stbi__parse_png_file((stbi__png *)&j,2,0);
  if (iVar6 != 0) goto LAB_001058d9;
  (j.s)->img_buffer = (j.s)->img_buffer_original;
  iVar6 = stbi__gif_header(s,(stbi__gif *)&j,comp,1);
  if (iVar6 != 0) {
    if (x != (int *)0x0) {
      *x = (int)j.s;
    }
    if (y != (int *)0x0) {
      *y = j.s._4_4_;
      return 1;
    }
    return 1;
  }
  s->img_buffer = s->img_buffer_original;
  sVar2 = stbi__get8(s);
  if ((sVar2 == 'B') && (sVar2 = stbi__get8(s), sVar2 == 'M')) {
    stbi__skip(s,0xc);
    sVar7 = stbi__get32le(s);
    if ((sVar7 == 0x7c) || (((sVar7 == 0x28 || (sVar7 == 0x38)) || (sVar7 == 0x6c)))) {
      sVar7 = stbi__get32le(s);
      *x = sVar7;
      sVar7 = stbi__get32le(s);
    }
    else {
      if (sVar7 != 0xc) goto LAB_00105a04;
      iVar6 = stbi__get16le(s);
      *x = iVar6;
      sVar7 = stbi__get16le(s);
    }
    *y = sVar7;
    iVar6 = stbi__get16le(s);
    if (iVar6 == 1) {
      uVar8 = stbi__get16le(s);
      *comp = uVar8 >> 3;
      return 1;
    }
  }
LAB_00105a04:
  s->img_buffer = s->img_buffer_original;
  sVar7 = stbi__get32be(s);
  if ((sVar7 == 0x38425053) && (iVar6 = stbi__get16be(s), iVar6 == 1)) {
    stbi__skip(s,6);
    uVar8 = stbi__get16be(s);
    if (uVar8 < 0x11) {
      sVar7 = stbi__get32be(s);
      *y = sVar7;
      sVar7 = stbi__get32be(s);
      *x = sVar7;
      iVar6 = stbi__get16be(s);
      if ((iVar6 == 8) && (iVar6 = stbi__get16be(s), iVar6 == 3)) {
        *comp = 4;
        return 1;
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  stbi__skip(s,0x5c);
  iVar6 = stbi__get16be(s);
  *x = iVar6;
  iVar6 = stbi__get16be(s);
  *y = iVar6;
  iVar6 = stbi__at_eof(s);
  if (iVar6 == 0) {
    if ((*x == 0) || (*y <= (int)(0x10000000 / (long)*x))) {
      stbi__skip(s,8);
      bVar3 = 0;
      iVar6 = 0xb;
      while (iVar6 = iVar6 + -1, iVar6 != 0) {
        sVar2 = stbi__get8(s);
        sVar4 = stbi__get8(s);
        stbi__get8(s);
        bVar5 = stbi__get8(s);
        iVar9 = stbi__at_eof(s);
        if ((iVar9 != 0) || (sVar4 != '\b')) goto LAB_00105af2;
        bVar3 = bVar3 | bVar5;
        if (sVar2 == '\0') {
          *comp = 4 - (uint)((bVar3 & 0x10) == 0);
          return 1;
        }
      }
    }
    else {
LAB_00105af2:
      s->img_buffer = s->img_buffer_original;
    }
  }
  iVar6 = stbi__pnm_info(s,x,y,comp);
  if (iVar6 != 0) {
    return 1;
  }
  stbi__hdr_gettoken(s,(char *)&j);
  iVar6 = bcmp(&j,"#?RADIANCE",0xb);
  if (iVar6 == 0) {
    bVar1 = false;
    while( true ) {
      stbi__hdr_gettoken(s,(char *)&j);
      if ((char)j.s == '\0') break;
      iVar6 = bcmp(&j,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar6 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      stbi__hdr_gettoken(s,(char *)&j);
      iVar6 = bcmp(&j,"-Y ",3);
      if (iVar6 == 0) {
        local_4890 = (char *)((long)&j.s + 3);
        lVar10 = strtol(local_4890,&local_4890,10);
        *y = (int)lVar10;
        __nptr = local_4890 + 2;
        do {
          pcVar11 = __nptr;
          __nptr = pcVar11 + 1;
        } while (pcVar11[-2] == ' ');
        if (((pcVar11[-2] == '+') && (pcVar11[-1] == 'X')) && (*pcVar11 == ' ')) {
          local_4890 = __nptr;
          lVar10 = strtol(__nptr,(char **)0x0,10);
          *x = (int)lVar10;
          *comp = 3;
          return 1;
        }
      }
    }
  }
  s->img_buffer = s->img_buffer_original;
  stbi__get8(s);
  bVar3 = stbi__get8(s);
  if (bVar3 < 2) {
    bVar3 = stbi__get8(s);
    if ((byte)((bVar3 & 0xf7) - 4) < 0xfd) goto LAB_00105c22;
    stbi__skip(s,9);
    iVar6 = stbi__get16le(s);
    if (((iVar6 != 0) && (iVar9 = stbi__get16le(s), iVar9 != 0)) &&
       (bVar3 = stbi__get8(s), (byte)(bVar3 << 5 | (byte)(bVar3 - 8) >> 3) < 4)) {
      *x = iVar6;
      *y = iVar9;
      if (comp == (int *)0x0) {
        return 1;
      }
      *comp = (uint)(bVar3 >> 3);
      return 1;
    }
  }
  s->img_buffer = s->img_buffer_original;
LAB_00105c22:
  stbi__g_failure_reason = "Image not of any known type, or corrupt";
  return 0;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}